

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.cpp
# Opt level: O3

void anon_unknown.dwarf_6b76b0::ripemd160::Transform(uint32_t *s,uchar *chunk)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  long in_FS_OFFSET;
  
  lVar22 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *s;
  uVar2 = s[1];
  uVar3 = s[2];
  uVar4 = s[3];
  uVar5 = s[4];
  iVar6 = *(int *)chunk;
  iVar7 = *(int *)(chunk + 4);
  iVar8 = *(int *)(chunk + 0x14);
  uVar24 = (uVar3 ^ uVar2 ^ uVar4) + iVar6 + uVar1;
  uVar25 = (uVar24 * 0x800 | uVar24 >> 0x15) + uVar5;
  uVar26 = uVar3 << 10 | uVar3 >> 0x16;
  uVar29 = uVar1 + iVar8 + 0x50a28be6 + ((~uVar4 | uVar3) ^ uVar2);
  uVar24 = (uVar26 ^ uVar2 ^ uVar25) + iVar7 + uVar5;
  uVar30 = (uVar29 * 0x100 | uVar29 >> 0x18) + uVar5;
  iVar9 = *(int *)(chunk + 0x38);
  uVar31 = uVar5 + iVar9 + 0x50a28be6 + ((~uVar26 | uVar2) ^ uVar30);
  uVar23 = uVar2 << 10 | uVar2 >> 0x16;
  uVar29 = (uVar24 * 0x4000 | uVar24 >> 0x12) + uVar4;
  iVar10 = *(int *)(chunk + 8);
  uVar24 = (uVar25 ^ uVar23 ^ uVar29) + iVar10 + uVar4;
  uVar32 = (uVar31 * 0x200 | uVar31 >> 0x17) + uVar4;
  iVar11 = *(int *)(chunk + 0x1c);
  uVar28 = uVar4 + iVar11 + 0x50a28be6 + ((~uVar23 | uVar30) ^ uVar32);
  uVar27 = (uVar24 * 0x8000 | uVar24 >> 0x11) + uVar26;
  uVar31 = uVar25 * 0x400 | uVar25 >> 0x16;
  iVar12 = *(int *)(chunk + 0xc);
  uVar24 = (uVar29 ^ uVar31 ^ uVar27) + iVar12 + uVar26;
  uVar28 = (uVar28 * 0x200 | uVar28 >> 0x17) + uVar26;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar26 = uVar26 + iVar6 + 0x50a28be6 + ((~uVar30 | uVar32) ^ uVar28);
  uVar24 = (uVar24 * 0x1000 | uVar24 >> 0x14) + uVar23;
  uVar25 = uVar29 * 0x400 | uVar29 >> 0x16;
  iVar13 = *(int *)(chunk + 0x10);
  uVar29 = (uVar27 ^ uVar25 ^ uVar24) + iVar13 + uVar23;
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar26 = (uVar26 * 0x800 | uVar26 >> 0x15) + uVar23;
  iVar14 = *(int *)(chunk + 0x24);
  uVar23 = uVar23 + iVar14 + 0x50a28be6 + ((~uVar32 | uVar28) ^ uVar26);
  uVar29 = (uVar29 * 0x20 | uVar29 >> 0x1b) + uVar31;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar31 = uVar31 + iVar8 + (uVar24 ^ uVar27 ^ uVar29);
  uVar23 = (uVar23 * 0x2000 | uVar23 >> 0x13) + uVar30;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar30 = uVar30 + iVar10 + 0x50a28be6 + ((~uVar28 | uVar26) ^ uVar23);
  uVar31 = (uVar31 * 0x100 | uVar31 >> 0x18) + uVar25;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  iVar15 = *(int *)(chunk + 0x18);
  uVar25 = uVar25 + iVar15 + (uVar29 ^ uVar24 ^ uVar31);
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar30 = (uVar30 * 0x8000 | uVar30 >> 0x11) + uVar32;
  iVar16 = *(int *)(chunk + 0x2c);
  uVar32 = uVar32 + iVar16 + 0x50a28be6 + ((~uVar26 | uVar23) ^ uVar30);
  uVar25 = (uVar25 * 0x80 | uVar25 >> 0x19) + uVar27;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar27 = uVar27 + iVar11 + (uVar31 ^ uVar29 ^ uVar25);
  uVar32 = (uVar32 * 0x8000 | uVar32 >> 0x11) + uVar28;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar28 = uVar28 + iVar13 + 0x50a28be6 + ((~uVar23 | uVar30) ^ uVar32);
  uVar27 = (uVar27 * 0x200 | uVar27 >> 0x17) + uVar24;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  iVar17 = *(int *)(chunk + 0x20);
  uVar24 = uVar24 + iVar17 + (uVar25 ^ uVar31 ^ uVar27);
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar28 = (uVar28 * 0x20 | uVar28 >> 0x1b) + uVar26;
  iVar18 = *(int *)(chunk + 0x34);
  uVar26 = uVar26 + iVar18 + 0x50a28be6 + ((~uVar30 | uVar32) ^ uVar28);
  uVar24 = (uVar24 * 0x800 | uVar24 >> 0x15) + uVar29;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar29 = uVar29 + iVar14 + (uVar27 ^ uVar25 ^ uVar24);
  uVar26 = (uVar26 * 0x80 | uVar26 >> 0x19) + uVar23;
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar23 = uVar23 + iVar15 + 0x50a28be6 + ((~uVar32 | uVar28) ^ uVar26);
  uVar29 = (uVar29 * 0x2000 | uVar29 >> 0x13) + uVar31;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  iVar19 = *(int *)(chunk + 0x28);
  uVar31 = uVar31 + iVar19 + (uVar24 ^ uVar27 ^ uVar29);
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar23 = (uVar23 * 0x80 | uVar23 >> 0x19) + uVar30;
  iVar20 = *(int *)(chunk + 0x3c);
  uVar30 = uVar30 + iVar20 + 0x50a28be6 + ((~uVar28 | uVar26) ^ uVar23);
  uVar31 = (uVar31 * 0x4000 | uVar31 >> 0x12) + uVar25;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar25 = uVar25 + iVar16 + (uVar29 ^ uVar24 ^ uVar31);
  uVar30 = (uVar30 * 0x100 | uVar30 >> 0x18) + uVar32;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar32 = uVar32 + iVar17 + 0x50a28be6 + ((~uVar26 | uVar23) ^ uVar30);
  iVar21 = *(int *)(chunk + 0x30);
  uVar25 = (uVar25 * 0x8000 | uVar25 >> 0x11) + uVar27;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar27 = uVar27 + iVar21 + (uVar31 ^ uVar29 ^ uVar25);
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar32 = (uVar32 * 0x800 | uVar32 >> 0x15) + uVar28;
  uVar28 = uVar28 + iVar7 + 0x50a28be6 + ((~uVar23 | uVar30) ^ uVar32);
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar27 = (uVar27 * 0x40 | uVar27 >> 0x1a) + uVar24;
  uVar24 = uVar24 + iVar18 + (uVar25 ^ uVar31 ^ uVar27);
  uVar28 = (uVar28 * 0x4000 | uVar28 >> 0x12) + uVar26;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar26 = uVar26 + iVar19 + 0x50a28be6 + ((~uVar30 | uVar32) ^ uVar28);
  uVar24 = (uVar24 * 0x80 | uVar24 >> 0x19) + uVar29;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar29 = uVar29 + iVar9 + (uVar27 ^ uVar25 ^ uVar24);
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar26 = (uVar26 * 0x4000 | uVar26 >> 0x12) + uVar23;
  uVar23 = uVar23 + iVar12 + 0x50a28be6 + ((~uVar32 | uVar28) ^ uVar26);
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar29 = (uVar29 * 0x200 | uVar29 >> 0x17) + uVar31;
  uVar31 = uVar31 + iVar20 + (uVar24 ^ uVar27 ^ uVar29);
  uVar23 = (uVar23 * 0x1000 | uVar23 >> 0x14) + uVar30;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar30 = uVar30 + iVar21 + 0x50a28be6 + ((~uVar28 | uVar26) ^ uVar23);
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar31 = (uVar31 * 0x100 | uVar31 >> 0x18) + uVar25;
  uVar30 = (uVar30 * 0x40 | uVar30 >> 0x1a) + uVar32;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar32 = uVar32 + iVar15 + (~uVar26 & uVar23) + 0x5c4dd124 + (uVar30 & uVar26);
  uVar25 = uVar25 + iVar11 + (uVar31 & uVar29) + (~uVar31 & uVar24) + 0x5a827999;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar25 = (uVar25 * 0x80 | uVar25 >> 0x19) + uVar27;
  uVar32 = (uVar32 * 0x200 | uVar32 >> 0x17) + uVar28;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar28 = uVar28 + iVar16 + (~uVar23 & uVar30) + 0x5c4dd124 + (uVar32 & uVar23);
  uVar27 = uVar27 + iVar13 + (uVar25 & uVar31) + (~uVar25 & uVar29) + 0x5a827999;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar27 = (uVar27 * 0x40 | uVar27 >> 0x1a) + uVar24;
  uVar28 = (uVar28 * 0x2000 | uVar28 >> 0x13) + uVar26;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar26 = uVar26 + iVar12 + (~uVar30 & uVar32) + 0x5c4dd124 + (uVar28 & uVar30);
  uVar24 = uVar24 + iVar18 + (uVar27 & uVar25) + (~uVar27 & uVar31) + 0x5a827999;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar24 = (uVar24 * 0x100 | uVar24 >> 0x18) + uVar29;
  uVar26 = (uVar26 * 0x8000 | uVar26 >> 0x11) + uVar23;
  uVar33 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar23 = uVar23 + iVar11 + (~uVar33 & uVar28) + 0x5c4dd124 + (uVar26 & uVar33);
  uVar29 = uVar29 + iVar7 + (uVar24 & uVar27) + (~uVar24 & uVar25) + 0x5a827999;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar29 = (uVar29 * 0x2000 | uVar29 >> 0x13) + uVar31;
  uVar23 = (uVar23 * 0x80 | uVar23 >> 0x19) + uVar30;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar30 = uVar30 + iVar6 + (~uVar28 & uVar26) + 0x5c4dd124 + (uVar23 & uVar28);
  uVar31 = uVar31 + iVar19 + (uVar29 & uVar24) + (~uVar29 & uVar27) + 0x5a827999;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar31 = (uVar31 * 0x800 | uVar31 >> 0x15) + uVar25;
  uVar32 = (uVar30 * 0x1000 | uVar30 >> 0x14) + uVar33;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar30 = uVar33 + iVar18 + (~uVar26 & uVar23) + 0x5c4dd124 + (uVar32 & uVar26);
  uVar25 = uVar25 + iVar15 + (uVar31 & uVar29) + (~uVar31 & uVar24) + 0x5a827999;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar25 = (uVar25 * 0x200 | uVar25 >> 0x17) + uVar27;
  uVar33 = (uVar30 * 0x100 | uVar30 >> 0x18) + uVar28;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar28 = uVar28 + iVar8 + (~uVar23 & uVar32) + 0x5c4dd124 + (uVar33 & uVar23);
  uVar27 = uVar27 + iVar20 + (uVar25 & uVar31) + (~uVar25 & uVar29) + 0x5a827999;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar27 = (uVar27 * 0x80 | uVar27 >> 0x19) + uVar24;
  uVar30 = (uVar28 * 0x200 | uVar28 >> 0x17) + uVar26;
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar26 = uVar26 + iVar19 + (~uVar32 & uVar33) + 0x5c4dd124 + (uVar30 & uVar32);
  uVar24 = uVar24 + iVar12 + (uVar27 & uVar25) + (~uVar27 & uVar31) + 0x5a827999;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar24 = (uVar24 * 0x8000 | uVar24 >> 0x11) + uVar29;
  uVar26 = (uVar26 * 0x800 | uVar26 >> 0x15) + uVar23;
  uVar33 = uVar33 * 0x400 | uVar33 >> 0x16;
  uVar23 = uVar23 + iVar9 + (~uVar33 & uVar30) + 0x5c4dd124 + (uVar26 & uVar33);
  uVar29 = uVar29 + iVar21 + (uVar24 & uVar27) + (~uVar24 & uVar25) + 0x5a827999;
  uVar28 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar29 = (uVar29 * 0x80 | uVar29 >> 0x19) + uVar31;
  uVar23 = (uVar23 * 0x80 | uVar23 >> 0x19) + uVar32;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar27 = uVar32 + iVar20 + (~uVar30 & uVar26) + 0x5c4dd124 + (uVar23 & uVar30);
  uVar31 = uVar31 + iVar6 + (uVar29 & uVar24) + (~uVar29 & uVar28) + 0x5a827999;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar31 = (uVar31 * 0x1000 | uVar31 >> 0x14) + uVar25;
  uVar32 = (uVar27 * 0x80 | uVar27 >> 0x19) + uVar33;
  uVar27 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar26 = uVar33 + iVar17 + (~uVar27 & uVar23) + 0x5c4dd124 + (uVar32 & uVar27);
  uVar25 = uVar25 + iVar14 + (uVar31 & uVar29) + (~uVar31 & uVar24) + 0x5a827999;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar25 = (uVar25 * 0x8000 | uVar25 >> 0x11) + uVar28;
  uVar33 = (uVar26 * 0x1000 | uVar26 >> 0x14) + uVar30;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar30 = uVar30 + iVar21 + (~uVar23 & uVar32) + 0x5c4dd124 + (uVar33 & uVar23);
  uVar26 = uVar28 + iVar8 + (uVar25 & uVar31) + (~uVar25 & uVar29) + 0x5a827999;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar26 = (uVar26 * 0x200 | uVar26 >> 0x17) + uVar24;
  uVar28 = (uVar30 * 0x80 | uVar30 >> 0x19) + uVar27;
  uVar30 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar27 = uVar27 + iVar13 + (~uVar30 & uVar33) + 0x5c4dd124 + (uVar28 & uVar30);
  uVar24 = uVar24 + iVar10 + (uVar26 & uVar25) + (~uVar26 & uVar31) + 0x5a827999;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar24 = (uVar24 * 0x800 | uVar24 >> 0x15) + uVar29;
  uVar27 = (uVar27 * 0x40 | uVar27 >> 0x1a) + uVar23;
  uVar33 = uVar33 * 0x400 | uVar33 >> 0x16;
  uVar23 = uVar23 + iVar14 + (~uVar33 & uVar28) + 0x5c4dd124 + (uVar27 & uVar33);
  uVar29 = uVar29 + iVar9 + (uVar24 & uVar26) + (~uVar24 & uVar25) + 0x5a827999;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar29 = (uVar29 * 0x80 | uVar29 >> 0x19) + uVar31;
  uVar23 = (uVar23 * 0x8000 | uVar23 >> 0x11) + uVar30;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar30 = uVar30 + iVar7 + (~uVar28 & uVar27) + 0x5c4dd124 + (uVar23 & uVar28);
  uVar31 = uVar31 + iVar16 + (uVar29 & uVar24) + (~uVar29 & uVar26) + 0x5a827999;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar31 = (uVar31 * 0x2000 | uVar31 >> 0x13) + uVar25;
  uVar25 = uVar25 + iVar17 + (uVar31 & uVar29) + (uVar24 & ~uVar31) + 0x5a827999;
  uVar32 = (uVar30 * 0x2000 | uVar30 >> 0x13) + uVar33;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar30 = uVar33 + iVar10 + (~uVar27 & uVar23) + 0x5c4dd124 + (uVar32 & uVar27);
  uVar25 = (uVar25 * 0x1000 | uVar25 >> 0x14) + uVar26;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar26 = uVar26 + iVar12 + 0x6ed9eba1 + ((~uVar31 | uVar25) ^ uVar29);
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar33 = (uVar30 * 0x800 | uVar30 >> 0x15) + uVar28;
  uVar30 = uVar28 + iVar20 + 0x6d703ef3 + ((~uVar32 | uVar33) ^ uVar23);
  uVar26 = (uVar26 * 0x800 | uVar26 >> 0x15) + uVar24;
  uVar28 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar24 = uVar24 + iVar19 + 0x6ed9eba1 + ((~uVar25 | uVar26) ^ uVar28);
  uVar30 = (uVar30 * 0x200 | uVar30 >> 0x17) + uVar27;
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar31 = uVar27 + iVar8 + 0x6d703ef3 + ((~uVar33 | uVar30) ^ uVar32);
  uVar24 = (uVar24 * 0x2000 | uVar24 >> 0x13) + uVar29;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar29 = uVar29 + iVar9 + 0x6ed9eba1 + ((~uVar26 | uVar24) ^ uVar25);
  uVar27 = (uVar31 * 0x80 | uVar31 >> 0x19) + uVar23;
  uVar33 = uVar33 * 0x400 | uVar33 >> 0x16;
  uVar23 = uVar23 + iVar7 + 0x6d703ef3 + ((~uVar30 | uVar27) ^ uVar33);
  uVar29 = (uVar29 * 0x40 | uVar29 >> 0x1a) + uVar28;
  uVar31 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar26 = uVar28 + iVar13 + 0x6ed9eba1 + ((~uVar24 | uVar29) ^ uVar31);
  uVar23 = (uVar23 * 0x8000 | uVar23 >> 0x11) + uVar32;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar32 = uVar32 + iVar12 + 0x6d703ef3 + ((~uVar27 | uVar23) ^ uVar30);
  uVar28 = (uVar26 * 0x80 | uVar26 >> 0x19) + uVar25;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar25 = uVar25 + iVar14 + 0x6ed9eba1 + ((~uVar29 | uVar28) ^ uVar24);
  uVar32 = (uVar32 * 0x800 | uVar32 >> 0x15) + uVar33;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar26 = uVar33 + iVar11 + 0x6d703ef3 + ((~uVar23 | uVar32) ^ uVar27);
  uVar25 = (uVar25 * 0x4000 | uVar25 >> 0x12) + uVar31;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar31 = uVar31 + iVar20 + 0x6ed9eba1 + ((~uVar28 | uVar25) ^ uVar29);
  uVar33 = (uVar26 * 0x100 | uVar26 >> 0x18) + uVar30;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar30 = uVar30 + iVar9 + 0x6d703ef3 + ((~uVar32 | uVar33) ^ uVar23);
  uVar26 = (uVar31 * 0x200 | uVar31 >> 0x17) + uVar24;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar24 = uVar24 + iVar17 + 0x6ed9eba1 + ((~uVar25 | uVar26) ^ uVar28);
  uVar30 = (uVar30 * 0x40 | uVar30 >> 0x1a) + uVar27;
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar27 = uVar27 + iVar15 + 0x6d703ef3 + ((~uVar33 | uVar30) ^ uVar32);
  uVar24 = (uVar24 * 0x2000 | uVar24 >> 0x13) + uVar29;
  uVar31 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar29 = uVar29 + iVar7 + 0x6ed9eba1 + ((~uVar26 | uVar24) ^ uVar31);
  uVar27 = (uVar27 * 0x40 | uVar27 >> 0x1a) + uVar23;
  uVar33 = uVar33 * 0x400 | uVar33 >> 0x16;
  uVar23 = uVar23 + iVar14 + 0x6d703ef3 + ((~uVar30 | uVar27) ^ uVar33);
  uVar29 = (uVar29 * 0x8000 | uVar29 >> 0x11) + uVar28;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar28 = uVar28 + iVar10 + 0x6ed9eba1 + ((~uVar24 | uVar29) ^ uVar26);
  uVar25 = (uVar23 * 0x4000 | uVar23 >> 0x12) + uVar32;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar32 = uVar32 + iVar16 + 0x6d703ef3 + ((~uVar27 | uVar25) ^ uVar30);
  uVar28 = (uVar28 * 0x4000 | uVar28 >> 0x12) + uVar31;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar23 = uVar31 + iVar11 + 0x6ed9eba1 + ((~uVar29 | uVar28) ^ uVar24);
  uVar32 = (uVar32 * 0x1000 | uVar32 >> 0x14) + uVar33;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar33 = uVar33 + iVar17 + 0x6d703ef3 + ((~uVar25 | uVar32) ^ uVar27);
  uVar31 = (uVar23 * 0x100 | uVar23 >> 0x18) + uVar26;
  uVar23 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar29 = uVar26 + iVar6 + 0x6ed9eba1 + ((~uVar28 | uVar31) ^ uVar23);
  uVar33 = (uVar33 * 0x2000 | uVar33 >> 0x13) + uVar30;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar30 = uVar30 + iVar21 + 0x6d703ef3 + ((~uVar32 | uVar33) ^ uVar25);
  uVar26 = (uVar29 * 0x2000 | uVar29 >> 0x13) + uVar24;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar24 = uVar24 + iVar15 + 0x6ed9eba1 + ((~uVar31 | uVar26) ^ uVar28);
  uVar30 = (uVar30 * 0x20 | uVar30 >> 0x1b) + uVar27;
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar27 = uVar27 + iVar10 + 0x6d703ef3 + ((~uVar33 | uVar30) ^ uVar32);
  uVar29 = (uVar24 * 0x40 | uVar24 >> 0x1a) + uVar23;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar24 = uVar23 + iVar18 + 0x6ed9eba1 + ((~uVar26 | uVar29) ^ uVar31);
  uVar27 = (uVar27 * 0x4000 | uVar27 >> 0x12) + uVar25;
  uVar33 = uVar33 * 0x400 | uVar33 >> 0x16;
  uVar25 = uVar25 + iVar19 + 0x6d703ef3 + ((~uVar30 | uVar27) ^ uVar33);
  uVar23 = (uVar24 * 0x20 | uVar24 >> 0x1b) + uVar28;
  uVar24 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar26 = uVar28 + iVar16 + 0x6ed9eba1 + ((~uVar29 | uVar23) ^ uVar24);
  uVar25 = (uVar25 * 0x2000 | uVar25 >> 0x13) + uVar32;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar32 = uVar32 + iVar6 + 0x6d703ef3 + ((~uVar27 | uVar25) ^ uVar30);
  uVar28 = (uVar26 * 0x1000 | uVar26 >> 0x14) + uVar31;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar31 = uVar31 + iVar8 + 0x6ed9eba1 + ((~uVar23 | uVar28) ^ uVar29);
  uVar32 = (uVar32 * 0x2000 | uVar32 >> 0x13) + uVar33;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar26 = uVar33 + iVar13 + 0x6d703ef3 + ((~uVar25 | uVar32) ^ uVar27);
  uVar31 = (uVar31 * 0x80 | uVar31 >> 0x19) + uVar24;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar24 = uVar24 + iVar21 + 0x6ed9eba1 + ((~uVar28 | uVar31) ^ uVar23);
  uVar33 = (uVar26 * 0x80 | uVar26 >> 0x19) + uVar30;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar30 = uVar30 + iVar18 + 0x6d703ef3 + ((~uVar32 | uVar33) ^ uVar25);
  uVar26 = (uVar24 * 0x20 | uVar24 >> 0x1b) + uVar29;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar24 = uVar29 + iVar7 + (~uVar28 & uVar31) + -0x70e44324 + (uVar26 & uVar28);
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar30 = (uVar30 * 0x20 | uVar30 >> 0x1b) + uVar27;
  uVar24 = (uVar24 * 0x800 | uVar24 >> 0x15) + uVar23;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar29 = uVar23 + iVar14 + (~uVar31 & uVar26) + -0x70e44324 + (uVar24 & uVar31);
  uVar23 = uVar27 + iVar17 + (uVar30 & uVar33) + (~uVar30 & uVar32) + 0x7a6d76e9;
  uVar27 = (uVar23 * 0x8000 | uVar23 >> 0x11) + uVar25;
  uVar33 = uVar33 * 0x400 | uVar33 >> 0x16;
  uVar29 = (uVar29 * 0x1000 | uVar29 >> 0x14) + uVar28;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar28 = uVar28 + iVar16 + (~uVar26 & uVar24) + -0x70e44324 + (uVar29 & uVar26);
  uVar23 = uVar25 + iVar15 + (uVar27 & uVar30) + (~uVar27 & uVar33) + 0x7a6d76e9;
  uVar23 = (uVar23 * 0x20 | uVar23 >> 0x1b) + uVar32;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar28 = (uVar28 * 0x4000 | uVar28 >> 0x12) + uVar31;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar25 = uVar31 + iVar19 + (~uVar24 & uVar29) + -0x70e44324 + (uVar28 & uVar24);
  uVar31 = uVar32 + iVar13 + (uVar23 & uVar27) + (~uVar23 & uVar30) + 0x7a6d76e9;
  uVar32 = (uVar31 * 0x100 | uVar31 >> 0x18) + uVar33;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar25 = (uVar25 * 0x8000 | uVar25 >> 0x11) + uVar26;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar31 = uVar26 + iVar6 + (~uVar29 & uVar28) + -0x70e44324 + (uVar25 & uVar29);
  uVar26 = uVar33 + iVar7 + (uVar32 & uVar23) + (~uVar32 & uVar27) + 0x7a6d76e9;
  uVar33 = (uVar26 * 0x800 | uVar26 >> 0x15) + uVar30;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar31 = (uVar31 * 0x4000 | uVar31 >> 0x12) + uVar24;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar24 = uVar24 + iVar17 + (~uVar28 & uVar25) + -0x70e44324 + (uVar31 & uVar28);
  uVar26 = uVar30 + iVar12 + (uVar33 & uVar32) + (~uVar33 & uVar23) + 0x7a6d76e9;
  uVar30 = (uVar26 * 0x4000 | uVar26 >> 0x12) + uVar27;
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar24 = (uVar24 * 0x8000 | uVar24 >> 0x11) + uVar29;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar29 = uVar29 + iVar21 + (~uVar25 & uVar31) + -0x70e44324 + (uVar24 & uVar25);
  uVar26 = uVar27 + iVar16 + (uVar30 & uVar33) + (~uVar30 & uVar32) + 0x7a6d76e9;
  uVar26 = (uVar26 * 0x4000 | uVar26 >> 0x12) + uVar23;
  uVar33 = uVar33 * 0x400 | uVar33 >> 0x16;
  uVar29 = (uVar29 * 0x200 | uVar29 >> 0x17) + uVar28;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar27 = uVar28 + iVar13 + (~uVar31 & uVar24) + -0x70e44324 + (uVar29 & uVar31);
  uVar23 = uVar23 + iVar20 + (uVar26 & uVar30) + (~uVar26 & uVar33) + 0x7a6d76e9;
  uVar23 = (uVar23 * 0x40 | uVar23 >> 0x1a) + uVar32;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar27 = (uVar27 * 0x100 | uVar27 >> 0x18) + uVar25;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar25 = uVar25 + iVar18 + (~uVar24 & uVar29) + -0x70e44324 + (uVar27 & uVar24);
  uVar28 = uVar32 + iVar6 + (uVar23 & uVar26) + (~uVar23 & uVar30) + 0x7a6d76e9;
  uVar32 = (uVar28 * 0x4000 | uVar28 >> 0x12) + uVar33;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar25 = (uVar25 * 0x200 | uVar25 >> 0x17) + uVar31;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar31 = uVar31 + iVar12 + (~uVar29 & uVar27) + -0x70e44324 + (uVar25 & uVar29);
  uVar28 = uVar33 + iVar8 + (uVar32 & uVar23) + (~uVar32 & uVar26) + 0x7a6d76e9;
  uVar33 = (uVar28 * 0x40 | uVar28 >> 0x1a) + uVar30;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar31 = (uVar31 * 0x4000 | uVar31 >> 0x12) + uVar24;
  uVar28 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar24 = uVar24 + iVar11 + (~uVar28 & uVar25) + -0x70e44324 + (uVar31 & uVar28);
  uVar27 = uVar30 + iVar21 + (uVar33 & uVar32) + (~uVar33 & uVar23) + 0x7a6d76e9;
  uVar30 = (uVar27 * 0x200 | uVar27 >> 0x17) + uVar26;
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar24 = (uVar24 * 0x20 | uVar24 >> 0x1b) + uVar29;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar29 = uVar29 + iVar20 + (~uVar25 & uVar31) + -0x70e44324 + (uVar24 & uVar25);
  uVar26 = uVar26 + iVar10 + (uVar30 & uVar33) + (~uVar30 & uVar32) + 0x7a6d76e9;
  uVar27 = (uVar26 * 0x1000 | uVar26 >> 0x14) + uVar23;
  uVar33 = uVar33 * 0x400 | uVar33 >> 0x16;
  uVar29 = (uVar29 * 0x40 | uVar29 >> 0x1a) + uVar28;
  uVar26 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar31 = uVar28 + iVar9 + (~uVar26 & uVar24) + -0x70e44324 + (uVar29 & uVar26);
  uVar23 = uVar23 + iVar18 + (uVar27 & uVar30) + (~uVar27 & uVar33) + 0x7a6d76e9;
  uVar23 = (uVar23 * 0x200 | uVar23 >> 0x17) + uVar32;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar28 = (uVar31 * 0x100 | uVar31 >> 0x18) + uVar25;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar31 = uVar25 + iVar8 + (~uVar24 & uVar29) + -0x70e44324 + (uVar28 & uVar24);
  uVar25 = uVar32 + iVar14 + (uVar23 & uVar27) + (~uVar23 & uVar30) + 0x7a6d76e9;
  uVar32 = (uVar25 * 0x1000 | uVar25 >> 0x14) + uVar33;
  uVar25 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar31 = (uVar31 * 0x40 | uVar31 >> 0x1a) + uVar26;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar26 = uVar26 + iVar15 + (~uVar29 & uVar28) + -0x70e44324 + (uVar31 & uVar29);
  uVar27 = uVar33 + iVar11 + (uVar32 & uVar23) + (~uVar32 & uVar25) + 0x7a6d76e9;
  uVar33 = (uVar27 * 0x20 | uVar27 >> 0x1b) + uVar30;
  uVar27 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar26 = (uVar26 * 0x20 | uVar26 >> 0x1b) + uVar24;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar24 = uVar24 + iVar10 + (~uVar28 & uVar31) + -0x70e44324 + (uVar26 & uVar28);
  uVar23 = uVar30 + iVar19 + (uVar33 & uVar32) + (~uVar33 & uVar27) + 0x7a6d76e9;
  uVar30 = (uVar23 * 0x8000 | uVar23 >> 0x11) + uVar25;
  uVar23 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar25 = uVar25 + iVar9 + (uVar30 & uVar33) + (~uVar30 & uVar23) + 0x7a6d76e9;
  uVar24 = (uVar24 * 0x1000 | uVar24 >> 0x14) + uVar29;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar29 = uVar29 + iVar13 + -0x56ac02b2 + ((~uVar31 | uVar26) ^ uVar24);
  uVar32 = uVar33 * 0x400 | uVar33 >> 0x16;
  uVar25 = (uVar25 * 0x100 | uVar25 >> 0x18) + uVar27;
  uVar27 = uVar27 + iVar21 + (uVar30 ^ uVar32 ^ uVar25);
  uVar29 = (uVar29 * 0x200 | uVar29 >> 0x17) + uVar28;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar28 = uVar28 + iVar6 + -0x56ac02b2 + ((~uVar26 | uVar24) ^ uVar29);
  uVar27 = (uVar27 * 0x100 | uVar27 >> 0x18) + uVar23;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar23 = uVar23 + iVar20 + (uVar25 ^ uVar30 ^ uVar27);
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar28 = (uVar28 * 0x8000 | uVar28 >> 0x11) + uVar31;
  uVar31 = uVar31 + iVar8 + -0x56ac02b2 + ((~uVar24 | uVar29) ^ uVar28);
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar23 = (uVar23 * 0x20 | uVar23 >> 0x1b) + uVar32;
  uVar32 = uVar32 + iVar19 + (uVar27 ^ uVar25 ^ uVar23);
  uVar31 = (uVar31 * 0x20 | uVar31 >> 0x1b) + uVar26;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar26 = uVar26 + iVar14 + -0x56ac02b2 + ((~uVar29 | uVar28) ^ uVar31);
  uVar32 = (uVar32 * 0x1000 | uVar32 >> 0x14) + uVar30;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar30 = uVar30 + iVar13 + (uVar23 ^ uVar27 ^ uVar32);
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar26 = (uVar26 * 0x800 | uVar26 >> 0x15) + uVar24;
  uVar24 = uVar24 + iVar11 + -0x56ac02b2 + ((~uVar28 | uVar31) ^ uVar26);
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar30 = (uVar30 * 0x200 | uVar30 >> 0x17) + uVar25;
  uVar25 = uVar25 + iVar7 + (uVar32 ^ uVar23 ^ uVar30);
  uVar24 = (uVar24 * 0x40 | uVar24 >> 0x1a) + uVar29;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar29 = uVar29 + iVar21 + -0x56ac02b2 + ((~uVar31 | uVar26) ^ uVar24);
  uVar25 = (uVar25 * 0x1000 | uVar25 >> 0x14) + uVar27;
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar27 = uVar27 + iVar8 + (uVar30 ^ uVar32 ^ uVar25);
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar29 = (uVar29 * 0x100 | uVar29 >> 0x18) + uVar28;
  uVar28 = uVar28 + iVar10 + -0x56ac02b2 + ((~uVar26 | uVar24) ^ uVar29);
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar27 = (uVar27 * 0x20 | uVar27 >> 0x1b) + uVar23;
  uVar23 = uVar23 + iVar17 + (uVar25 ^ uVar30 ^ uVar27);
  uVar28 = (uVar28 * 0x2000 | uVar28 >> 0x13) + uVar31;
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar31 = uVar31 + iVar19 + -0x56ac02b2 + ((~uVar24 | uVar29) ^ uVar28);
  uVar23 = (uVar23 * 0x4000 | uVar23 >> 0x12) + uVar32;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar32 = uVar32 + iVar11 + (uVar27 ^ uVar25 ^ uVar23);
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar31 = (uVar31 * 0x1000 | uVar31 >> 0x14) + uVar26;
  uVar26 = uVar26 + iVar9 + -0x56ac02b2 + ((~uVar29 | uVar28) ^ uVar31);
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar32 = (uVar32 * 0x40 | uVar32 >> 0x1a) + uVar30;
  uVar30 = uVar30 + iVar15 + (uVar23 ^ uVar27 ^ uVar32);
  uVar26 = (uVar26 * 0x20 | uVar26 >> 0x1b) + uVar24;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar24 = uVar24 + iVar7 + -0x56ac02b2 + ((~uVar28 | uVar31) ^ uVar26);
  uVar30 = (uVar30 * 0x100 | uVar30 >> 0x18) + uVar25;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar25 = uVar25 + iVar10 + (uVar32 ^ uVar23 ^ uVar30);
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar24 = (uVar24 * 0x1000 | uVar24 >> 0x14) + uVar29;
  uVar29 = uVar29 + iVar12 + -0x56ac02b2 + ((~uVar31 | uVar26) ^ uVar24);
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar25 = (uVar25 * 0x2000 | uVar25 >> 0x13) + uVar27;
  uVar27 = uVar27 + iVar18 + (uVar30 ^ uVar32 ^ uVar25);
  uVar29 = (uVar29 * 0x2000 | uVar29 >> 0x13) + uVar28;
  uVar26 = uVar26 * 0x400 | uVar26 >> 0x16;
  uVar28 = uVar28 + iVar17 + -0x56ac02b2 + ((~uVar26 | uVar24) ^ uVar29);
  uVar27 = (uVar27 * 0x40 | uVar27 >> 0x1a) + uVar23;
  uVar30 = uVar30 * 0x400 | uVar30 >> 0x16;
  uVar23 = uVar23 + iVar9 + (uVar25 ^ uVar30 ^ uVar27);
  uVar24 = uVar24 * 0x400 | uVar24 >> 0x16;
  uVar28 = (uVar28 * 0x4000 | uVar28 >> 0x12) + uVar31;
  uVar31 = uVar31 + iVar16 + -0x56ac02b2 + ((~uVar24 | uVar29) ^ uVar28);
  uVar23 = (uVar23 * 0x20 | uVar23 >> 0x1b) + uVar32;
  uVar25 = uVar25 * 0x400 | uVar25 >> 0x16;
  uVar32 = uVar32 + iVar6 + (uVar27 ^ uVar25 ^ uVar23);
  uVar31 = (uVar31 * 0x800 | uVar31 >> 0x15) + uVar26;
  uVar29 = uVar29 * 0x400 | uVar29 >> 0x16;
  uVar26 = uVar26 + iVar15 + -0x56ac02b2 + ((~uVar29 | uVar28) ^ uVar31);
  uVar32 = (uVar32 * 0x8000 | uVar32 >> 0x11) + uVar30;
  uVar27 = uVar27 * 0x400 | uVar27 >> 0x16;
  uVar30 = uVar30 + iVar12 + (uVar23 ^ uVar27 ^ uVar32);
  uVar26 = (uVar26 * 0x100 | uVar26 >> 0x18) + uVar24;
  uVar28 = uVar28 * 0x400 | uVar28 >> 0x16;
  uVar24 = uVar24 + iVar20 + -0x56ac02b2 + ((~uVar28 | uVar31) ^ uVar26);
  uVar30 = (uVar30 * 0x2000 | uVar30 >> 0x13) + uVar25;
  uVar23 = uVar23 * 0x400 | uVar23 >> 0x16;
  uVar25 = uVar25 + iVar14 + (uVar32 ^ uVar23 ^ uVar30);
  uVar24 = (uVar24 * 0x20 | uVar24 >> 0x1b) + uVar29;
  uVar31 = uVar31 * 0x400 | uVar31 >> 0x16;
  uVar29 = uVar29 + iVar18 + -0x56ac02b2 + ((~uVar31 | uVar26) ^ uVar24);
  uVar25 = (uVar25 * 0x800 | uVar25 >> 0x15) + uVar27;
  uVar32 = uVar32 * 0x400 | uVar32 >> 0x16;
  uVar27 = uVar27 + iVar16 + (uVar30 ^ uVar32 ^ uVar25);
  *s = (uVar30 * 0x400 | uVar30 >> 0x16) + uVar2 + uVar24;
  s[1] = uVar32 + uVar3 + (uVar26 * 0x400 | uVar26 >> 0x16);
  s[2] = uVar4 + uVar23 + uVar31;
  s[3] = uVar5 + uVar28 + uVar23 + (uVar27 * 0x800 | uVar27 >> 0x15);
  s[4] = uVar28 + uVar1 + uVar25 + (uVar29 * 0x40 | uVar29 >> 0x1a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar22) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Transform(uint32_t* s, const unsigned char* chunk)
{
    uint32_t a1 = s[0], b1 = s[1], c1 = s[2], d1 = s[3], e1 = s[4];
    uint32_t a2 = a1, b2 = b1, c2 = c1, d2 = d1, e2 = e1;
    uint32_t w0 = ReadLE32(chunk + 0), w1 = ReadLE32(chunk + 4), w2 = ReadLE32(chunk + 8), w3 = ReadLE32(chunk + 12);
    uint32_t w4 = ReadLE32(chunk + 16), w5 = ReadLE32(chunk + 20), w6 = ReadLE32(chunk + 24), w7 = ReadLE32(chunk + 28);
    uint32_t w8 = ReadLE32(chunk + 32), w9 = ReadLE32(chunk + 36), w10 = ReadLE32(chunk + 40), w11 = ReadLE32(chunk + 44);
    uint32_t w12 = ReadLE32(chunk + 48), w13 = ReadLE32(chunk + 52), w14 = ReadLE32(chunk + 56), w15 = ReadLE32(chunk + 60);

    R11(a1, b1, c1, d1, e1, w0, 11);
    R12(a2, b2, c2, d2, e2, w5, 8);
    R11(e1, a1, b1, c1, d1, w1, 14);
    R12(e2, a2, b2, c2, d2, w14, 9);
    R11(d1, e1, a1, b1, c1, w2, 15);
    R12(d2, e2, a2, b2, c2, w7, 9);
    R11(c1, d1, e1, a1, b1, w3, 12);
    R12(c2, d2, e2, a2, b2, w0, 11);
    R11(b1, c1, d1, e1, a1, w4, 5);
    R12(b2, c2, d2, e2, a2, w9, 13);
    R11(a1, b1, c1, d1, e1, w5, 8);
    R12(a2, b2, c2, d2, e2, w2, 15);
    R11(e1, a1, b1, c1, d1, w6, 7);
    R12(e2, a2, b2, c2, d2, w11, 15);
    R11(d1, e1, a1, b1, c1, w7, 9);
    R12(d2, e2, a2, b2, c2, w4, 5);
    R11(c1, d1, e1, a1, b1, w8, 11);
    R12(c2, d2, e2, a2, b2, w13, 7);
    R11(b1, c1, d1, e1, a1, w9, 13);
    R12(b2, c2, d2, e2, a2, w6, 7);
    R11(a1, b1, c1, d1, e1, w10, 14);
    R12(a2, b2, c2, d2, e2, w15, 8);
    R11(e1, a1, b1, c1, d1, w11, 15);
    R12(e2, a2, b2, c2, d2, w8, 11);
    R11(d1, e1, a1, b1, c1, w12, 6);
    R12(d2, e2, a2, b2, c2, w1, 14);
    R11(c1, d1, e1, a1, b1, w13, 7);
    R12(c2, d2, e2, a2, b2, w10, 14);
    R11(b1, c1, d1, e1, a1, w14, 9);
    R12(b2, c2, d2, e2, a2, w3, 12);
    R11(a1, b1, c1, d1, e1, w15, 8);
    R12(a2, b2, c2, d2, e2, w12, 6);

    R21(e1, a1, b1, c1, d1, w7, 7);
    R22(e2, a2, b2, c2, d2, w6, 9);
    R21(d1, e1, a1, b1, c1, w4, 6);
    R22(d2, e2, a2, b2, c2, w11, 13);
    R21(c1, d1, e1, a1, b1, w13, 8);
    R22(c2, d2, e2, a2, b2, w3, 15);
    R21(b1, c1, d1, e1, a1, w1, 13);
    R22(b2, c2, d2, e2, a2, w7, 7);
    R21(a1, b1, c1, d1, e1, w10, 11);
    R22(a2, b2, c2, d2, e2, w0, 12);
    R21(e1, a1, b1, c1, d1, w6, 9);
    R22(e2, a2, b2, c2, d2, w13, 8);
    R21(d1, e1, a1, b1, c1, w15, 7);
    R22(d2, e2, a2, b2, c2, w5, 9);
    R21(c1, d1, e1, a1, b1, w3, 15);
    R22(c2, d2, e2, a2, b2, w10, 11);
    R21(b1, c1, d1, e1, a1, w12, 7);
    R22(b2, c2, d2, e2, a2, w14, 7);
    R21(a1, b1, c1, d1, e1, w0, 12);
    R22(a2, b2, c2, d2, e2, w15, 7);
    R21(e1, a1, b1, c1, d1, w9, 15);
    R22(e2, a2, b2, c2, d2, w8, 12);
    R21(d1, e1, a1, b1, c1, w5, 9);
    R22(d2, e2, a2, b2, c2, w12, 7);
    R21(c1, d1, e1, a1, b1, w2, 11);
    R22(c2, d2, e2, a2, b2, w4, 6);
    R21(b1, c1, d1, e1, a1, w14, 7);
    R22(b2, c2, d2, e2, a2, w9, 15);
    R21(a1, b1, c1, d1, e1, w11, 13);
    R22(a2, b2, c2, d2, e2, w1, 13);
    R21(e1, a1, b1, c1, d1, w8, 12);
    R22(e2, a2, b2, c2, d2, w2, 11);

    R31(d1, e1, a1, b1, c1, w3, 11);
    R32(d2, e2, a2, b2, c2, w15, 9);
    R31(c1, d1, e1, a1, b1, w10, 13);
    R32(c2, d2, e2, a2, b2, w5, 7);
    R31(b1, c1, d1, e1, a1, w14, 6);
    R32(b2, c2, d2, e2, a2, w1, 15);
    R31(a1, b1, c1, d1, e1, w4, 7);
    R32(a2, b2, c2, d2, e2, w3, 11);
    R31(e1, a1, b1, c1, d1, w9, 14);
    R32(e2, a2, b2, c2, d2, w7, 8);
    R31(d1, e1, a1, b1, c1, w15, 9);
    R32(d2, e2, a2, b2, c2, w14, 6);
    R31(c1, d1, e1, a1, b1, w8, 13);
    R32(c2, d2, e2, a2, b2, w6, 6);
    R31(b1, c1, d1, e1, a1, w1, 15);
    R32(b2, c2, d2, e2, a2, w9, 14);
    R31(a1, b1, c1, d1, e1, w2, 14);
    R32(a2, b2, c2, d2, e2, w11, 12);
    R31(e1, a1, b1, c1, d1, w7, 8);
    R32(e2, a2, b2, c2, d2, w8, 13);
    R31(d1, e1, a1, b1, c1, w0, 13);
    R32(d2, e2, a2, b2, c2, w12, 5);
    R31(c1, d1, e1, a1, b1, w6, 6);
    R32(c2, d2, e2, a2, b2, w2, 14);
    R31(b1, c1, d1, e1, a1, w13, 5);
    R32(b2, c2, d2, e2, a2, w10, 13);
    R31(a1, b1, c1, d1, e1, w11, 12);
    R32(a2, b2, c2, d2, e2, w0, 13);
    R31(e1, a1, b1, c1, d1, w5, 7);
    R32(e2, a2, b2, c2, d2, w4, 7);
    R31(d1, e1, a1, b1, c1, w12, 5);
    R32(d2, e2, a2, b2, c2, w13, 5);

    R41(c1, d1, e1, a1, b1, w1, 11);
    R42(c2, d2, e2, a2, b2, w8, 15);
    R41(b1, c1, d1, e1, a1, w9, 12);
    R42(b2, c2, d2, e2, a2, w6, 5);
    R41(a1, b1, c1, d1, e1, w11, 14);
    R42(a2, b2, c2, d2, e2, w4, 8);
    R41(e1, a1, b1, c1, d1, w10, 15);
    R42(e2, a2, b2, c2, d2, w1, 11);
    R41(d1, e1, a1, b1, c1, w0, 14);
    R42(d2, e2, a2, b2, c2, w3, 14);
    R41(c1, d1, e1, a1, b1, w8, 15);
    R42(c2, d2, e2, a2, b2, w11, 14);
    R41(b1, c1, d1, e1, a1, w12, 9);
    R42(b2, c2, d2, e2, a2, w15, 6);
    R41(a1, b1, c1, d1, e1, w4, 8);
    R42(a2, b2, c2, d2, e2, w0, 14);
    R41(e1, a1, b1, c1, d1, w13, 9);
    R42(e2, a2, b2, c2, d2, w5, 6);
    R41(d1, e1, a1, b1, c1, w3, 14);
    R42(d2, e2, a2, b2, c2, w12, 9);
    R41(c1, d1, e1, a1, b1, w7, 5);
    R42(c2, d2, e2, a2, b2, w2, 12);
    R41(b1, c1, d1, e1, a1, w15, 6);
    R42(b2, c2, d2, e2, a2, w13, 9);
    R41(a1, b1, c1, d1, e1, w14, 8);
    R42(a2, b2, c2, d2, e2, w9, 12);
    R41(e1, a1, b1, c1, d1, w5, 6);
    R42(e2, a2, b2, c2, d2, w7, 5);
    R41(d1, e1, a1, b1, c1, w6, 5);
    R42(d2, e2, a2, b2, c2, w10, 15);
    R41(c1, d1, e1, a1, b1, w2, 12);
    R42(c2, d2, e2, a2, b2, w14, 8);

    R51(b1, c1, d1, e1, a1, w4, 9);
    R52(b2, c2, d2, e2, a2, w12, 8);
    R51(a1, b1, c1, d1, e1, w0, 15);
    R52(a2, b2, c2, d2, e2, w15, 5);
    R51(e1, a1, b1, c1, d1, w5, 5);
    R52(e2, a2, b2, c2, d2, w10, 12);
    R51(d1, e1, a1, b1, c1, w9, 11);
    R52(d2, e2, a2, b2, c2, w4, 9);
    R51(c1, d1, e1, a1, b1, w7, 6);
    R52(c2, d2, e2, a2, b2, w1, 12);
    R51(b1, c1, d1, e1, a1, w12, 8);
    R52(b2, c2, d2, e2, a2, w5, 5);
    R51(a1, b1, c1, d1, e1, w2, 13);
    R52(a2, b2, c2, d2, e2, w8, 14);
    R51(e1, a1, b1, c1, d1, w10, 12);
    R52(e2, a2, b2, c2, d2, w7, 6);
    R51(d1, e1, a1, b1, c1, w14, 5);
    R52(d2, e2, a2, b2, c2, w6, 8);
    R51(c1, d1, e1, a1, b1, w1, 12);
    R52(c2, d2, e2, a2, b2, w2, 13);
    R51(b1, c1, d1, e1, a1, w3, 13);
    R52(b2, c2, d2, e2, a2, w13, 6);
    R51(a1, b1, c1, d1, e1, w8, 14);
    R52(a2, b2, c2, d2, e2, w14, 5);
    R51(e1, a1, b1, c1, d1, w11, 11);
    R52(e2, a2, b2, c2, d2, w0, 15);
    R51(d1, e1, a1, b1, c1, w6, 8);
    R52(d2, e2, a2, b2, c2, w3, 13);
    R51(c1, d1, e1, a1, b1, w15, 5);
    R52(c2, d2, e2, a2, b2, w9, 11);
    R51(b1, c1, d1, e1, a1, w13, 6);
    R52(b2, c2, d2, e2, a2, w11, 11);

    uint32_t t = s[0];
    s[0] = s[1] + c1 + d2;
    s[1] = s[2] + d1 + e2;
    s[2] = s[3] + e1 + a2;
    s[3] = s[4] + a1 + b2;
    s[4] = t + b1 + c2;
}